

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O2

Aig_Obj_t * Csw_ObjTwoVarCut(Csw_Man_t *p,Csw_Cut_t *pCut)

{
  uint uVar1;
  int iVar2;
  Aig_Obj_t *p0;
  Aig_Obj_t *p1;
  Aig_Obj_t *pAVar3;
  uint uVar4;
  Aig_Man_t *p_00;
  ulong uVar5;
  
  if (pCut->nFanins < '\x03') {
    __assert_fail("pCut->nFanins > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                  ,0x19d,"Aig_Obj_t *Csw_ObjTwoVarCut(Csw_Man_t *, Csw_Cut_t *)");
  }
  iVar2 = Csw_CutSupportMinimize(p,pCut);
  if (iVar2 != 2) {
    __assert_fail("nVars == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                  ,0x1a0,"Aig_Obj_t *Csw_ObjTwoVarCut(Csw_Man_t *, Csw_Cut_t *)");
  }
  p0 = Aig_ManObj(p->pManRes,*(int *)&pCut[1].pNext);
  p1 = Aig_ManObj(p->pManRes,*(int *)((long)&pCut[1].pNext + 4));
  uVar4 = *(uint *)((long)&pCut[1].pNext + (long)pCut->nLeafMax * 4) & 0xf;
  uVar1 = uVar4 - 7;
  if ((uVar1 < 8) && ((0xd1U >> (uVar1 & 0x1f) & 1) != 0)) {
    uVar4 = *(uint *)(&DAT_007fddc8 + (ulong)uVar1 * 4);
    uVar5 = 1;
  }
  else {
    uVar5 = 0;
  }
  pAVar3 = (Aig_Obj_t *)0x0;
  switch(uVar4) {
  case 1:
    p_00 = p->pManRes;
    p0 = (Aig_Obj_t *)((ulong)p0 ^ 1);
    goto LAB_0041e062;
  case 2:
    p_00 = p->pManRes;
LAB_0041e062:
    p1 = (Aig_Obj_t *)((ulong)p1 ^ 1);
    break;
  default:
    goto switchD_0041e048_caseD_3;
  case 4:
    p_00 = p->pManRes;
    p0 = (Aig_Obj_t *)((ulong)p0 ^ 1);
    break;
  case 8:
    p_00 = p->pManRes;
  }
  pAVar3 = Aig_And(p_00,p0,p1);
  if (pAVar3 == (Aig_Obj_t *)0x0) {
    pAVar3 = (Aig_Obj_t *)0x0;
  }
  else {
    pAVar3 = (Aig_Obj_t *)(uVar5 ^ (ulong)pAVar3);
  }
switchD_0041e048_caseD_3:
  return pAVar3;
}

Assistant:

Aig_Obj_t * Csw_ObjTwoVarCut( Csw_Man_t * p, Csw_Cut_t * pCut )
{
    Aig_Obj_t * pRes, * pIn0, * pIn1;
    int nVars, uTruth, fCompl = 0;
    assert( pCut->nFanins > 2 );
    // minimize support of this cut
    nVars = Csw_CutSupportMinimize( p, pCut );
    assert( nVars == 2 );
    // get the fanins
    pIn0 = Aig_ManObj( p->pManRes, pCut->pFanins[0] );
    pIn1 = Aig_ManObj( p->pManRes, pCut->pFanins[1] );
    // derive the truth table
    uTruth = 0xF & *Csw_CutTruth(pCut);
    if ( uTruth == 14 || uTruth == 13 || uTruth == 11 || uTruth == 7 )
    {
        uTruth = 0xF & ~uTruth;
        fCompl = 1;
    }
    // compute the result
    pRes = NULL;
    if ( uTruth == 1  )  // 0001  // 1110  14
        pRes = Aig_And( p->pManRes, Aig_Not(pIn0), Aig_Not(pIn1) );
    if ( uTruth == 2  )  // 0010  // 1101  13 
        pRes = Aig_And( p->pManRes,         pIn0 , Aig_Not(pIn1) );
    if ( uTruth == 4  )  // 0100  // 1011  11
        pRes = Aig_And( p->pManRes, Aig_Not(pIn0),         pIn1  );
    if ( uTruth == 8  )  // 1000  // 0111   7
        pRes = Aig_And( p->pManRes,         pIn0 ,         pIn1  );
    if ( pRes )
        pRes = Aig_NotCond( pRes, fCompl );
    return pRes;
}